

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O2

void __thiscall Js::StringProfiler::PrintAll(StringProfiler *this)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  Type piVar4;
  undefined4 uVar5;
  KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics> *pKVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  uint i;
  ulong uVar10;
  int iVar11;
  Type in_R8;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  StringMetrics metrics_00;
  undefined1 local_68 [8];
  HistogramIndex index;
  undefined1 local_50 [8];
  StringMetrics metrics;
  undefined4 uStack_3c;
  uint local_38;
  uint local_34;
  uint length;
  
  uVar13 = 0;
  Output::Print(L"=============================================================\n");
  Output::Print(L"String Statistics\n");
  Output::Print(L"-------------------------------------------------------------\n");
  Output::Print(L"    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n");
  Output::Print(L" --------- ---------- ---------- ---------- ---------- ------\n");
  unique0x00004880 = &this->stringLengthMetrics;
  HistogramIndex::HistogramIndex
            ((HistogramIndex *)local_68,&this->allocator,
             (this->stringLengthMetrics).count - (this->stringLengthMetrics).freeCount);
  piVar4 = (this->stringLengthMetrics).buckets;
  uVar14 = (this->stringLengthMetrics).bucketCount;
  uVar9 = (uint)index.index;
  for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
    iVar11 = piVar4[uVar10];
    if (iVar11 != -1) {
      in_R8 = (this->stringLengthMetrics).entries;
      while (iVar11 != -1) {
        iVar2 = in_R8[iVar11].
                super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
                super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                next;
        pKVar6 = &in_R8[iVar11].
                  super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>;
        uVar3 = (pKVar6->
                super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                ).super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                value.count7BitASCII;
        uVar5 = (pKVar6->
                super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                ).super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                value.count8BitASCII;
        uVar12 = in_R8[iVar11].
                 super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
                 super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                 value.countUnicode + uVar3 + uVar5;
        ((UintUintPair *)((long)local_68 + (ulong)uVar9 * 8))->first =
             in_R8[iVar11].
             super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
             super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.key;
        ((UintUintPair *)((long)local_68 + (ulong)uVar9 * 8))->second = uVar12;
        uVar9 = uVar9 + 1;
        uVar13 = uVar13 + uVar12;
        iVar11 = iVar2;
        index.index._0_4_ = uVar9;
      }
    }
  }
  index._8_8_ = this;
  HistogramIndex::SortDescending((HistogramIndex *)local_68);
  uVar14 = 0;
  uVar9 = 0;
  uVar15 = 0;
  local_34 = 0;
  for (uVar12 = 0; uVar12 != (uint)index.index; uVar12 = uVar12 + 1) {
    local_38 = HistogramIndex::Get((HistogramIndex *)local_68,uVar12);
    bVar7 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(stack0xffffffffffffffc0,&local_38,(StringMetrics *)local_50)
    ;
    if (bVar7) {
      metrics_00.count8BitASCII = 0;
      metrics_00.count7BitASCII = metrics.count7BitASCII;
      metrics_00.countUnicode = uVar13;
      PrintOne((StringProfiler *)(ulong)local_38,local_50._0_4_,metrics_00,(uint)in_R8);
      local_34 = local_34 + local_50._0_4_;
      uVar15 = uVar15 + local_50._4_4_;
      uVar9 = uVar9 + metrics.count7BitASCII;
      if (uVar14 <= local_38) {
        uVar14 = local_38;
      }
    }
  }
  Output::Print(L"-------------------------------------------------------------\n");
  Output::Print(L"    Totals %10u %10u %10u %10u (100%%)\n",(ulong)local_34,(ulong)uVar15,
                (ulong)uVar9,(ulong)(uVar15 + uVar9 + local_34));
  lVar16 = index._8_8_;
  if (*(int *)(index._8_8_ + 0x88) != 0) {
    Output::Print(
                 L"WARNING: %u strings were not counted because they were allocated on a background thread\n"
                 );
  }
  Output::Print(L"\n");
  Output::Print(L"Max string length is %u chars\n",(ulong)uVar14);
  Output::Print(L"%u empty strings (Literals or BufferString) were requested\n",
                (ulong)*(uint *)(lVar16 + 0x94));
  Output::Print(L"%u single char strings (Literals or BufferString) were requested\n",
                (ulong)*(uint *)(lVar16 + 0x98));
  if (*(int *)(lVar16 + 0x90) == 0) {
    Output::Print(L"No embedded NULs were detected\n");
  }
  else {
    Output::Print(L"Embedded NULs: %u NULs in %u strings\n",(ulong)*(uint *)(lVar16 + 0x8c));
  }
  uVar14 = 0;
  Output::Print(L"\n");
  if (*(int *)(lVar16 + 0xf8) == *(int *)(lVar16 + 0x100)) {
    Output::Print(L"No string concatenations were performed\n");
  }
  else {
    Output::Print(L"String concatenations (Strings %u chars or longer are treated as \"Large\")\n",
                  0x14);
    Output::Print(L"   LHS +  RHS  SB    Concat   Buf  Other  Total\n");
    Output::Print(L"------ ------ ------ ------ ------ ------ ------\n");
    local_34 = 0;
    stack0xffffffffffffffc0 =
         (BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)((ulong)stack0xffffffffffffffc0 & 0xffffffff00000000);
    uVar9 = 0;
    uVar15 = 0;
    for (uVar10 = 0; uVar10 < *(uint *)(lVar16 + 0xf4); uVar10 = uVar10 + 1) {
      iVar11 = *(int *)(*(long *)(lVar16 + 0xd8) + uVar10 * 4);
      if (iVar11 != -1) {
        while (iVar11 != -1) {
          lVar8 = (long)iVar11;
          piVar1 = (int *)(*(long *)(lVar16 + 0xe0) + lVar8 * 0x1c);
          iVar11 = piVar1[4];
          PrintOneConcat((UintUintPair *)(piVar1 + 5),
                         (ConcatMetrics *)(*(long *)(lVar16 + 0xe0) + lVar8 * 0x1c));
          uVar14 = uVar14 + *piVar1 + piVar1[1] + piVar1[2] + piVar1[3];
          local_34 = local_34 + piVar1[1];
          stack0xffffffffffffffc0 =
               (BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)CONCAT44(uStack_3c,metrics.countUnicode + piVar1[2]);
          uVar9 = uVar9 + *piVar1;
          uVar15 = uVar15 + piVar1[3];
          lVar16 = index._8_8_;
        }
      }
    }
    Output::Print(L"-------------------------------------------------------\n");
    Output::Print(L"Total %6u %6u %6u %6u %6u\n",(ulong)uVar14,(ulong)uVar9,(ulong)local_34,
                  (ulong)stack0xffffffffffffffc0 & 0xffffffff,(ulong)uVar15);
  }
  Output::Flush();
  return;
}

Assistant:

void StringProfiler::PrintAll()
    {
        Output::Print(_u("=============================================================\n"));
        Output::Print(_u("String Statistics\n"));
        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n"));
        Output::Print(_u(" --------- ---------- ---------- ---------- ---------- ------\n"));

        // Build an index for printing the histogram in descending order
        HistogramIndex index(&allocator, stringLengthMetrics.Count());
        uint totalStringCount = 0;
        stringLengthMetrics.Map([this, &index, &totalStringCount](unsigned int len, StringMetrics metrics)
        {
            uint lengthTotal = metrics.Total();
            index.Add(len, lengthTotal);
            totalStringCount += lengthTotal;
        });
        index.SortDescending();

        StringMetrics cumulative = {};
        uint maxLength = 0;

        for(uint i = 0; i != index.Count(); ++i )
        {
            uint length = index.Get(i);

            // UintHashMap::Lookup doesn't work with value-types (it returns NULL
            // on error), so use TryGetValue instead.
            StringMetrics metrics;
            if( stringLengthMetrics.TryGetValue(length, &metrics) )
            {
                PrintOne( length, metrics, totalStringCount );

                cumulative.Accumulate(metrics);
                maxLength = max( maxLength, length );
            }
        }

        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Totals %10u %10u %10u %10u (100%%)\n"),
            cumulative.count7BitASCII,
            cumulative.count8BitASCII,
            cumulative.countUnicode,
            cumulative.Total() );

        if(discardedWrongThread>0)
        {
            Output::Print(_u("WARNING: %u strings were not counted because they were allocated on a background thread\n"),discardedWrongThread);
        }
        Output::Print(_u("\n"));
        Output::Print(_u("Max string length is %u chars\n"), maxLength);
        Output::Print(_u("%u empty strings (Literals or BufferString) were requested\n"), emptyStrings);
        Output::Print(_u("%u single char strings (Literals or BufferString) were requested\n"), singleCharStrings);
        if( this->embeddedNULStrings == 0 )
        {
            Output::Print(_u("No embedded NULs were detected\n"));
        }
        else
        {
            Output::Print(_u("Embedded NULs: %u NULs in %u strings\n"), this->embeddedNULChars, this->embeddedNULStrings);
        }
        Output::Print(_u("\n"));

        if(stringConcatMetrics.Count() == 0)
        {
            Output::Print(_u("No string concatenations were performed\n"));
        }
        else
        {
            Output::Print(_u("String concatenations (Strings %u chars or longer are treated as \"Large\")\n"), k_MaxConcatLength);
            Output::Print(_u("   LHS +  RHS  SB    Concat   Buf  Other  Total\n"));
            Output::Print(_u("------ ------ ------ ------ ------ ------ ------\n"));

            uint totalConcatenations = 0;
            uint totalConcatTree = 0;
            uint totalBufString = 0;
            uint totalCompoundString = 0;
            uint totalOther = 0;
            stringConcatMetrics.Map([&](UintUintPair const& key, const ConcatMetrics& metrics)
            {
                PrintOneConcat(key, metrics);
                totalConcatenations += metrics.Total();
                totalConcatTree += metrics.concatTreeCount;
                totalBufString += metrics.bufferStringBuilderCount;
                totalCompoundString += metrics.compoundStringCount;
                totalOther += metrics.unknownCount;
            }
            );
            Output::Print(_u("-------------------------------------------------------\n"));
            Output::Print(_u("Total %6u %6u %6u %6u %6u\n"), totalConcatenations, totalCompoundString, totalConcatTree, totalBufString, totalOther);
        }

        Output::Flush();
    }